

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_goiffalse(FuncState *fs,expdesc *e)

{
  expkind eVar1;
  int local_1c;
  int pc;
  expdesc *e_local;
  FuncState *fs_local;
  
  luaK_dischargevars(fs,e);
  eVar1 = e->k;
  if ((eVar1 == VNIL) || (eVar1 == VFALSE)) {
    local_1c = -1;
  }
  else if (eVar1 == VJMP) {
    local_1c = (e->u).info;
  }
  else {
    local_1c = jumponcond(fs,e,1);
  }
  luaK_concat(fs,&e->t,local_1c);
  luaK_patchtohere(fs,e->f);
  e->f = -1;
  return;
}

Assistant:

void luaK_goiffalse(FuncState *fs, expdesc *e) {
    int pc;  /* pc of new jump */
    luaK_dischargevars(fs, e);
    switch (e->k) {
        case VJMP: {
            pc = e->u.info;  /* already jump if true */
            break;
        }
        case VNIL:
        case VFALSE: {
            pc = NO_JUMP;  /* always false; do nothing */
            break;
        }
        default: {
            pc = jumponcond(fs, e, 1);  /* jump if true */
            break;
        }
    }
    luaK_concat(fs, &e->t, pc);  /* insert new jump in 't' list */
    luaK_patchtohere(fs, e->f);  /* false list jumps to here (to go through) */
    e->f = NO_JUMP;
}